

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O0

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  DataKey *__filename_00;
  DataKey *hkey;
  Name nam;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_stack_ffffffffffffffe0;
  Name in_stack_ffffffffffffffe8;
  
  Name::Name((Name *)&stack0xffffffffffffffe8,__filename);
  bVar1 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::has
                    (in_stack_ffffffffffffffe0,(Name *)this);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    __filename_00 =
         DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::get
                   ((DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *)__filename,
                    (Name *)in_stack_ffffffffffffffe8.name);
    DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove
              (&this->hashtab,&stack0xffffffffffffffe8);
    iVar2 = DataSet<int>::remove(&this->set,(char *)__filename_00);
  }
  return iVar2;
}

Assistant:

void NameSet::remove(const char* str)
{
   const Name nam(str);

   if(hashtab.has(nam))
   {
      const DataKey* hkey = hashtab.get(nam);
      assert(hkey != nullptr);
      hashtab.remove(nam);
      set.remove(*hkey);
   }
}